

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlv.cpp
# Opt level: O0

TlvPtr __thiscall
ot::commissioner::tlv::Tlv::Deserialize
          (Tlv *this,Error *aError,size_t *aOffset,ByteArray *aBuf,Scope aScope)

{
  undefined8 __n;
  bool bVar1;
  v10 *pvVar2;
  v10 *pvVar3;
  const_reference pvVar4;
  byte *pbVar5;
  element_type *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar7;
  TlvPtr TVar8;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  shared_ptr<ot::commissioner::tlv::Tlv> local_3e0;
  ErrorCode local_3d0;
  Scope local_3c9;
  shared_ptr<ot::commissioner::tlv::Tlv> local_3c8;
  anon_class_1_0_00000001 local_3b2;
  v10 local_3b1;
  v10 *local_3b0;
  char *local_3a8;
  string local_3a0;
  Error local_380;
  anon_class_1_0_00000001 local_352;
  v10 local_351;
  v10 *local_350;
  char *local_348;
  string local_340;
  Error local_320;
  anon_class_1_0_00000001 local_2e2;
  v10 local_2e1;
  v10 *local_2e0;
  size_t local_2d8;
  string local_2d0;
  Error local_2b0;
  undefined1 local_285;
  ushort local_284;
  undefined1 local_281 [5];
  uint16_t length;
  uint8_t type;
  size_t offset;
  Error error;
  Scope aScope_local;
  ByteArray *aBuf_local;
  size_t *aOffset_local;
  Error *aError_local;
  TlvPtr *tlv;
  undefined1 local_210 [16];
  v10 *local_200;
  ulong local_1f8;
  v10 *local_1f0;
  size_t sStack_1e8;
  string *local_1e0;
  v10 *local_1d8;
  v10 **local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  char *local_1a0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  *local_198;
  v10 *local_190;
  char *pcStack_188;
  string *local_180;
  v10 *local_178;
  v10 **local_170;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_unsigned_short>
  local_168;
  undefined1 local_148 [16];
  v10 *local_138;
  char *local_130;
  ushort *local_128;
  v10 *local_120;
  v10 *local_118;
  char *pcStack_110;
  string *local_108;
  v10 *local_100;
  v10 **local_f8;
  v10 **local_f0;
  v10 *local_e8;
  size_t sStack_e0;
  TlvPtr **local_d0;
  undefined1 *local_c8;
  TlvPtr **local_c0;
  TlvPtr **local_b8;
  undefined8 local_b0;
  undefined1 *local_a8;
  v10 **local_a0;
  v10 *local_98;
  char *pcStack_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_80;
  undefined1 *local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
  **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_unsigned_short>
  *local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_unsigned_short>
  *local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char,_unsigned_short>
  *local_10;
  
  error.mMessage.field_2._M_local_buf[0xf] = aScope;
  Error::Error((Error *)&offset);
  unique0x00012000 = *aOffset;
  local_285 = 0;
  std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
            ((shared_ptr<ot::commissioner::tlv::Tlv> *)this,(nullptr_t)0x0);
  pvVar2 = (v10 *)(stack0xfffffffffffffd80 + 2);
  pvVar3 = (v10 *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
  uVar6 = stack0xfffffffffffffd80;
  if (pvVar3 < pvVar2) {
    Deserialize::anon_class_1_0_00000001::operator()(&local_2e2);
    local_1d0 = &local_2e0;
    local_1d8 = &local_2e1;
    bVar7 = ::fmt::v10::operator()(local_1d8);
    local_2d8 = bVar7.size_;
    local_2e0 = (v10 *)bVar7.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_1e0 = &local_2d0;
    local_1f0 = local_2e0;
    sStack_1e8 = local_2d8;
    local_f0 = &local_1f0;
    local_200 = local_2e0;
    local_1f8 = local_2d8;
    local_e8 = local_200;
    sStack_e0 = local_1f8;
    tlv = (TlvPtr *)
          ::fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c8 = local_210;
    local_d0 = &tlv;
    local_b0 = 0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_d0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1f8;
    local_c0 = local_d0;
    local_b8 = local_d0;
    local_a8 = local_c8;
    ::fmt::v10::vformat_abi_cxx11_(&local_2d0,local_200,fmt,args);
    Error::Error(&local_2b0,kBadFormat,&local_2d0);
    Error::operator=((Error *)&offset,&local_2b0);
    Error::~Error(&local_2b0);
    std::__cxx11::string::~string((string *)&local_2d0);
  }
  else {
    register0x00000000 = stack0xfffffffffffffd80 + 1;
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,uVar6);
    uVar6 = stack0xfffffffffffffd80;
    local_281[0] = *pvVar4;
    unique0x10000682 = (v10 *)(stack0xfffffffffffffd80 + 1);
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,uVar6);
    local_284 = (ushort)*pbVar5;
    if (local_284 == 0xff) {
      pvVar2 = (v10 *)(stack0xfffffffffffffd80 + 2);
      pvVar3 = (v10 *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
      __n = stack0xfffffffffffffd80;
      if (pvVar3 < pvVar2) {
        Deserialize::anon_class_1_0_00000001::operator()(&local_352);
        local_170 = &local_350;
        local_178 = &local_351;
        bVar7 = ::fmt::v10::operator()(local_178);
        local_348 = (char *)bVar7.size_;
        local_350 = (v10 *)bVar7.data_;
        ::fmt::v10::detail::check_format_string<unsigned_char_&,_FMT_COMPILE_STRING,_0>();
        local_180 = &local_340;
        local_190 = local_350;
        pcStack_188 = local_348;
        local_198 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_char>
                     *)local_281;
        local_a0 = &local_190;
        local_1a8 = local_350;
        local_1a0 = local_348;
        local_98 = local_1a8;
        pcStack_90 = local_1a0;
        local_1c8[0] = ::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char>
                                 (local_198,(v10 *)uVar6,(uchar *)local_180);
        local_78 = local_1b8;
        local_80 = local_1c8;
        local_68 = 2;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_80;
        fmt_00.size_ = 2;
        fmt_00.data_ = local_1a0;
        local_70 = local_80;
        local_60 = local_78;
        local_58 = local_80;
        ::fmt::v10::vformat_abi_cxx11_(&local_340,local_1a8,fmt_00,args_00);
        Error::Error(&local_320,kBadFormat,&local_340);
        Error::operator=((Error *)&offset,&local_320);
        Error::~Error(&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        goto LAB_002cf425;
      }
      register0x00000000 = stack0xfffffffffffffd80 + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,__n);
      uVar6 = stack0xfffffffffffffd80;
      local_284 = (ushort)*pbVar5 << 8;
      register0x00000000 = stack0xfffffffffffffd80 + 1;
      pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](aBuf,uVar6);
      local_284 = local_284 | *pbVar5;
    }
    pvVar2 = (v10 *)(stack0xfffffffffffffd80 + (ulong)local_284);
    pvVar3 = (v10 *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(aBuf);
    if (pvVar3 < pvVar2) {
      Deserialize::anon_class_1_0_00000001::operator()(&local_3b2);
      local_f8 = &local_3b0;
      local_100 = &local_3b1;
      bVar7 = ::fmt::v10::operator()(local_100);
      local_3a8 = (char *)bVar7.size_;
      local_3b0 = (v10 *)bVar7.data_;
      ::fmt::v10::detail::
      check_format_string<unsigned_char_&,_unsigned_short_&,_FMT_COMPILE_STRING,_0>();
      local_108 = &local_3a0;
      local_118 = local_3b0;
      pcStack_110 = local_3a8;
      local_120 = (v10 *)local_281;
      local_128 = &local_284;
      local_50 = &local_118;
      local_138 = local_3b0;
      local_130 = local_3a8;
      local_48 = local_138;
      pcStack_40 = local_130;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_char,unsigned_short>
                (&local_168,local_120,(uchar *)local_128,(unsigned_short *)local_3b0);
      local_30 = local_148;
      local_38 = &local_168;
      local_20 = 0x22;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_38;
      fmt_01.size_ = 0x22;
      fmt_01.data_ = local_130;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_3a0,local_138,fmt_01,args_01);
      Error::Error(&local_380,kBadFormat,&local_3a0);
      Error::operator=((Error *)&offset,&local_380);
      Error::~Error(&local_380);
      std::__cxx11::string::~string((string *)&local_3a0);
    }
    else {
      local_3c9 = utils::from_underlying<ot::commissioner::tlv::Type>(local_281[0]);
      std::
      make_shared<ot::commissioner::tlv::Tlv,ot::commissioner::tlv::Type,ot::commissioner::tlv::Scope&>
                ((Type *)&local_3c8,&local_3c9);
      std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)this,&local_3c8);
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr(&local_3c8);
      this_00 = std::
                __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)this);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (aBuf,stack0xfffffffffffffd80);
      SetValue(this_00,pvVar4,(ulong)local_284);
      register0x00000000 = (ulong)local_284 + stack0xfffffffffffffd80;
    }
  }
LAB_002cf425:
  local_3d0 = kNone;
  bVar1 = commissioner::operator!=((Error *)&offset,&local_3d0);
  if (bVar1) {
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr(&local_3e0,(nullptr_t)0x0);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::operator=
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)this,&local_3e0);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr(&local_3e0);
  }
  else {
    *aOffset = stack0xfffffffffffffd80;
  }
  Error::operator=(aError,(Error *)&offset);
  local_285 = 1;
  Error::~Error((Error *)&offset);
  TVar8.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  TVar8.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (TlvPtr)TVar8.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TlvPtr Tlv::Deserialize(Error &aError, size_t &aOffset, const ByteArray &aBuf, Scope aScope)
{
    Error    error;
    size_t   offset = aOffset;
    uint8_t  type;
    uint16_t length;
    TlvPtr   tlv = nullptr;

    VerifyOrExit(offset + 2 <= aBuf.size(), error = ERROR_BAD_FORMAT("premature end of TLV"));
    type   = aBuf[offset++];
    length = aBuf[offset++];
    if (length == kEscapeLength)
    {
        VerifyOrExit(offset + 2 <= aBuf.size(),
                     error = ERROR_BAD_FORMAT("premature end of Extended TLV(type={})", type));

        length = (aBuf[offset++] << 8) & 0xFF00;
        length |= (aBuf[offset++]) & 0x00FF;
    }

    VerifyOrExit(offset + length <= aBuf.size(),
                 error = ERROR_BAD_FORMAT("premature end of TLV(type={}, length={})", type, length));

    tlv = std::make_shared<Tlv>(utils::from_underlying<Type>(type), aScope);
    tlv->SetValue(&aBuf[offset], length);

    offset += length;

exit:
    if (error != ErrorCode::kNone)
    {
        tlv = nullptr;
    }
    else
    {
        aOffset = offset;
    }

    aError = error;
    return tlv;
}